

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IStatefulPluginInterface.h
# Opt level: O0

InterfaceId * plugin::interfaces::IStatefulPluginInterface::GetInterfaceId(void)

{
  InterfaceId *in_RDI;
  allocator<char> local_31;
  string local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"IStatefulPluginInterface",&local_31);
  InterfaceId::InterfaceId(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return in_RDI;
}

Assistant:

static InterfaceId GetInterfaceId()
        {
            return InterfaceId("IStatefulPluginInterface");
        }